

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void __thiscall hbm::streaming::Controller::execute(Controller *this,Value *request)

{
  bool bVar1;
  Int IVar2;
  ostream *poVar3;
  Value *pVVar4;
  runtime_error *prVar5;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  Value result;
  string response;
  string requestString;
  string local_2c8;
  ostringstream msg;
  Reader reader;
  
  Json::FastWriter::FastWriter((FastWriter *)&msg);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)&requestString,(int)(FastWriter *)&msg,request,in_RCX);
  Json::FastWriter::~FastWriter((FastWriter *)&msg);
  HttpPost::execute(&response,&this->m_httpPost,&requestString);
  Json::Value::Value(&result,nullValue);
  Json::Reader::Reader(&reader);
  bVar1 = Json::Reader::parse(&reader,&response,&result,true);
  if (!bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_2c8,&reader);
    std::operator+(&local_350,"http response is not valid JSON \'",&local_2c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                   &local_350,"\'");
    std::runtime_error::runtime_error(prVar5,(string *)&msg);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = Json::Value::isMember(&result,"error");
  if (!bVar1) {
    Json::Reader::~Reader(&reader);
    Json::Value::~Value(&result);
    std::__cxx11::string::~string((string *)&response);
    std::__cxx11::string::~string((string *)&requestString);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar3 = std::operator<<((ostream *)&msg,"http response contains error: code=");
  pVVar4 = Json::Value::operator[](&result,"error");
  pVVar4 = Json::Value::operator[](pVVar4,"code");
  IVar2 = Json::Value::asInt(pVVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar2);
  poVar3 = std::operator<<(poVar3," \'");
  pVVar4 = Json::Value::operator[](&result,"error");
  pVVar4 = Json::Value::operator[](pVVar4,"message");
  Json::Value::asString_abi_cxx11_(&local_350,pVVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_350);
  std::operator<<(poVar3,"\'");
  std::__cxx11::string::~string((string *)&local_350);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,(string *)&local_350);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Controller::execute(const Json::Value &request)
		{
			std::string requestString = Json::FastWriter().write(request);

			std::string response = m_httpPost.execute(requestString);

			Json::Value result;
			Json::Reader reader;
			if(reader.parse(response, result)==false) {
				throw std::runtime_error("http response is not valid JSON '" + reader.getFormattedErrorMessages() + "'");
			}
			if(result.isMember(ERROR)) {
				std::ostringstream msg;
				msg << "http response contains error: code=" << result[ERROR]["code"].asInt() << " '" << result[ERROR]["message"].asString() << "'";
				throw std::runtime_error(msg.str());
			}
		}